

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void __thiscall vera::Camera::updateProjectionViewMatrix(Camera *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  int iVar29;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float local_78;
  float fStack_74;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  float *pfVar30;
  
  iVar29 = (*(this->super_Node)._vptr_Node[0x56])();
  pfVar30 = (float *)CONCAT44(extraout_var,iVar29);
  uVar10 = (this->m_projectionMatrix).value[0].field_0;
  uVar18 = (this->m_projectionMatrix).value[0].field_1;
  uVar11 = (this->m_projectionMatrix).value[0].field_2;
  uVar19 = (this->m_projectionMatrix).value[0].field_3;
  uVar12 = (this->m_projectionMatrix).value[1].field_0;
  uVar20 = (this->m_projectionMatrix).value[1].field_1;
  uVar13 = (this->m_projectionMatrix).value[1].field_2;
  uVar21 = (this->m_projectionMatrix).value[1].field_3;
  uVar14 = (this->m_projectionMatrix).value[2].field_0;
  uVar22 = (this->m_projectionMatrix).value[2].field_1;
  uVar15 = (this->m_projectionMatrix).value[2].field_2;
  uVar23 = (this->m_projectionMatrix).value[2].field_3;
  uVar16 = (this->m_projectionMatrix).value[3].field_0;
  uVar24 = (this->m_projectionMatrix).value[3].field_1;
  uVar17 = (this->m_projectionMatrix).value[3].field_2;
  uVar25 = (this->m_projectionMatrix).value[3].field_3;
  fVar4 = *pfVar30;
  fVar5 = pfVar30[1];
  fVar6 = pfVar30[2];
  fVar7 = pfVar30[3];
  fVar8 = pfVar30[4];
  fVar9 = pfVar30[5];
  fVar31 = pfVar30[6];
  fVar32 = pfVar30[7];
  fVar33 = pfVar30[8];
  fVar34 = pfVar30[9];
  fVar26 = pfVar30[10];
  fVar27 = pfVar30[0xb];
  fVar28 = pfVar30[0xc];
  fVar1 = pfVar30[0xd];
  fVar2 = pfVar30[0xe];
  fVar3 = pfVar30[0xf];
  (this->m_projectionViewMatrix).value[0].field_0.x =
       (float)uVar16 * fVar7 + (float)uVar14 * fVar6 + (float)uVar12 * fVar5 + (float)uVar10 * fVar4
  ;
  (this->m_projectionViewMatrix).value[0].field_1.y =
       (float)uVar24 * fVar7 + (float)uVar22 * fVar6 + (float)uVar20 * fVar5 + (float)uVar18 * fVar4
  ;
  (this->m_projectionViewMatrix).value[0].field_2.z =
       fVar7 * (float)uVar17 + fVar6 * (float)uVar15 + fVar5 * (float)uVar13 + fVar4 * (float)uVar11
  ;
  (this->m_projectionViewMatrix).value[0].field_3.w =
       fVar7 * (float)uVar25 + fVar6 * (float)uVar23 + fVar5 * (float)uVar21 + fVar4 * (float)uVar19
  ;
  (this->m_projectionViewMatrix).value[1].field_0.x =
       (float)uVar16 * fVar32 +
       (float)uVar14 * fVar31 + (float)uVar12 * fVar9 + (float)uVar10 * fVar8;
  (this->m_projectionViewMatrix).value[1].field_1.y =
       (float)uVar24 * fVar32 +
       (float)uVar22 * fVar31 + (float)uVar20 * fVar9 + (float)uVar18 * fVar8;
  (this->m_projectionViewMatrix).value[1].field_2.z =
       fVar32 * (float)uVar17 +
       fVar31 * (float)uVar15 + fVar9 * (float)uVar13 + fVar8 * (float)uVar11;
  (this->m_projectionViewMatrix).value[1].field_3.w =
       fVar32 * (float)uVar25 +
       fVar31 * (float)uVar23 + fVar9 * (float)uVar21 + fVar8 * (float)uVar19;
  (this->m_projectionViewMatrix).value[2].field_0.x =
       (float)uVar16 * fVar27 +
       (float)uVar14 * fVar26 + (float)uVar12 * fVar34 + (float)uVar10 * fVar33;
  (this->m_projectionViewMatrix).value[2].field_1.y =
       (float)uVar24 * fVar27 +
       (float)uVar22 * fVar26 + (float)uVar20 * fVar34 + (float)uVar18 * fVar33;
  (this->m_projectionViewMatrix).value[2].field_2.z =
       fVar27 * (float)uVar17 +
       fVar26 * (float)uVar15 + fVar34 * (float)uVar13 + fVar33 * (float)uVar11;
  (this->m_projectionViewMatrix).value[2].field_3.w =
       fVar27 * (float)uVar25 +
       fVar26 * (float)uVar23 + fVar34 * (float)uVar21 + fVar33 * (float)uVar19;
  (this->m_projectionViewMatrix).value[3].field_0.x =
       (float)uVar16 * fVar3 +
       (float)uVar14 * fVar2 + (float)uVar12 * fVar1 + (float)uVar10 * fVar28;
  (this->m_projectionViewMatrix).value[3].field_1.y =
       (float)uVar24 * fVar3 +
       (float)uVar22 * fVar2 + (float)uVar20 * fVar1 + (float)uVar18 * fVar28;
  (this->m_projectionViewMatrix).value[3].field_2.z =
       fVar3 * (float)uVar17 +
       fVar2 * (float)uVar15 + fVar1 * (float)uVar13 + fVar28 * (float)uVar11;
  (this->m_projectionViewMatrix).value[3].field_3.w =
       fVar3 * (float)uVar25 +
       fVar2 * (float)uVar23 + fVar1 * (float)uVar21 + fVar28 * (float)uVar19;
  iVar29 = (*(this->super_Node)._vptr_Node[0x56])(this);
  pfVar30 = (float *)CONCAT44(extraout_var_00,iVar29);
  fVar1 = *pfVar30;
  fVar2 = pfVar30[1];
  fVar3 = pfVar30[2];
  fVar4 = pfVar30[4];
  fVar5 = pfVar30[5];
  fVar6 = pfVar30[6];
  fVar7 = pfVar30[8];
  fVar8 = pfVar30[9];
  fVar9 = pfVar30[10];
  fVar31 = fVar5 * fVar9 - fVar6 * fVar8;
  fVar34 = fVar2 * fVar9 - fVar3 * fVar8;
  fVar32 = fVar2 * fVar6 - fVar3 * fVar5;
  fVar33 = 1.0 / (fVar7 * fVar32 + (fVar1 * fVar31 - fVar34 * fVar4));
  (this->m_normalMatrix).value[0].field_0.x = fVar31 * fVar33;
  (this->m_normalMatrix).value[0].field_1.y = -(fVar4 * fVar9 - fVar6 * fVar7) * fVar33;
  (this->m_normalMatrix).value[0].field_2.z = (fVar4 * fVar8 - fVar5 * fVar7) * fVar33;
  (this->m_normalMatrix).value[1].field_0.x = -fVar34 * fVar33;
  (this->m_normalMatrix).value[1].field_1.y = (fVar9 * fVar1 - fVar3 * fVar7) * fVar33;
  (this->m_normalMatrix).value[1].field_2.z = -(fVar8 * fVar1 - fVar7 * fVar2) * fVar33;
  (this->m_normalMatrix).value[2].field_0.x = fVar32 * fVar33;
  (this->m_normalMatrix).value[2].field_1.y = -(fVar6 * fVar1 - fVar3 * fVar4) * fVar33;
  (this->m_normalMatrix).value[2].field_2.z = (fVar1 * fVar5 - fVar2 * fVar4) * fVar33;
  iVar29 = (*(this->super_Node)._vptr_Node[0x56])(this);
  inverseMatrix((mat4 *)CONCAT44(extraout_var_01,iVar29));
  (this->m_inverseViewMatrix).value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_28;
  (this->m_inverseViewMatrix).value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_28._4_4_;
  (this->m_inverseViewMatrix).value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_20;
  (this->m_inverseViewMatrix).value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_20._4_4_;
  (this->m_inverseViewMatrix).value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_38;
  (this->m_inverseViewMatrix).value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_38._4_4_;
  (this->m_inverseViewMatrix).value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_30;
  (this->m_inverseViewMatrix).value[2].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_30._4_4_;
  (this->m_inverseViewMatrix).value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_48;
  (this->m_inverseViewMatrix).value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_48._4_4_;
  (this->m_inverseViewMatrix).value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_40;
  (this->m_inverseViewMatrix).value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_40._4_4_;
  (this->m_inverseViewMatrix).value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_58;
  (this->m_inverseViewMatrix).value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_58._4_4_;
  (this->m_inverseViewMatrix).value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_50;
  (this->m_inverseViewMatrix).value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_50._4_4_;
  inverseMatrix(&this->m_projectionMatrix);
  (this->m_inverseProjectionMatrix).value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_28;
  (this->m_inverseProjectionMatrix).value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_28._4_4_;
  (this->m_inverseProjectionMatrix).value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_20;
  (this->m_inverseProjectionMatrix).value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_20._4_4_;
  (this->m_inverseProjectionMatrix).value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_38;
  (this->m_inverseProjectionMatrix).value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_38._4_4_;
  (this->m_inverseProjectionMatrix).value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_30;
  (this->m_inverseProjectionMatrix).value[2].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_30._4_4_;
  (this->m_inverseProjectionMatrix).value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_48;
  (this->m_inverseProjectionMatrix).value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_48._4_4_;
  (this->m_inverseProjectionMatrix).value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_40;
  (this->m_inverseProjectionMatrix).value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_40._4_4_;
  (this->m_inverseProjectionMatrix).value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_58;
  (this->m_inverseProjectionMatrix).value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_58._4_4_;
  (this->m_inverseProjectionMatrix).value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)uStack_50;
  (this->m_inverseProjectionMatrix).value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_50._4_4_;
  (this->super_Node).bChange = true;
  return;
}

Assistant:

void Camera::updateProjectionViewMatrix() {
    m_projectionViewMatrix = m_projectionMatrix * getViewMatrix();
    m_normalMatrix = glm::transpose(glm::inverse(glm::mat3(getViewMatrix())));

    m_inverseViewMatrix = vera::inverseMatrix(getViewMatrix());
    m_inverseProjectionMatrix = vera::inverseMatrix(m_projectionMatrix);
    
    bChange = true;
}